

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

void __thiscall
google::
dense_hashtable<const_char_*,_const_char_*,_std::hash<const_char_*>,_google::dense_hash_set<const_char_*,_std::hash<const_char_*>,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>::Identity,_google::dense_hash_set<const_char_*,_std::hash<const_char_*>,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>::SetKey,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>
::clear_to_size(dense_hashtable<const_char_*,_const_char_*,_std::hash<const_char_*>,_google::dense_hash_set<const_char_*,_std::hash<const_char_*>,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>::Identity,_google::dense_hash_set<const_char_*,_std::hash<const_char_*>,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>::SetKey,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>
                *this,size_type new_num_buckets)

{
  char *pcVar1;
  undefined1 auVar2 [16];
  pointer ptr;
  ulong uVar3;
  undefined1 auVar4 [16];
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  long lVar7;
  
  ptr = this->table;
  if (ptr == (pointer)0x0) {
    ptr = (pointer)malloc(new_num_buckets * 8);
  }
  else {
    if (this->num_buckets == new_num_buckets) goto LAB_00a5cd87;
    ptr = alloc_impl<google::libc_allocator_with_realloc<const_char_*>_>::realloc_or_die
                    ((alloc_impl<google::libc_allocator_with_realloc<const_char_*>_> *)
                     &this->field_0x48,ptr,new_num_buckets);
  }
  this->table = ptr;
LAB_00a5cd87:
  auVar2 = _DAT_00a8f670;
  if (new_num_buckets != 0) {
    pcVar1 = (this->key_info).empty_key;
    lVar7 = new_num_buckets - 1;
    auVar4._8_4_ = (int)lVar7;
    auVar4._0_8_ = lVar7;
    auVar4._12_4_ = (int)((ulong)lVar7 >> 0x20);
    uVar3 = 0;
    auVar4 = auVar4 ^ _DAT_00a8f670;
    auVar6 = _DAT_00a8f660;
    do {
      auVar8 = auVar6 ^ auVar2;
      if ((bool)(~(auVar8._4_4_ == auVar4._4_4_ && auVar4._0_4_ < auVar8._0_4_ ||
                  auVar4._4_4_ < auVar8._4_4_) & 1)) {
        ptr[uVar3] = pcVar1;
      }
      if ((auVar8._12_4_ != auVar4._12_4_ || auVar8._8_4_ <= auVar4._8_4_) &&
          auVar8._12_4_ <= auVar4._12_4_) {
        ptr[uVar3 + 1] = pcVar1;
      }
      uVar3 = uVar3 + 2;
      lVar7 = auVar6._8_8_;
      auVar6._0_8_ = auVar6._0_8_ + 2;
      auVar6._8_8_ = lVar7 + 2;
    } while ((new_num_buckets + 1 & 0xfffffffffffffffe) != uVar3);
  }
  this->num_deleted = 0;
  this->num_elements = 0;
  this->num_buckets = new_num_buckets;
  fVar5 = (this->settings).
          super_sh_hashtable_settings<const_char_*,_std::hash<const_char_*>,_unsigned_long,_4>.
          enlarge_factor_ * (float)new_num_buckets;
  uVar3 = (ulong)fVar5;
  (this->settings).
  super_sh_hashtable_settings<const_char_*,_std::hash<const_char_*>,_unsigned_long,_4>.
  enlarge_threshold_ = (long)(fVar5 - 9.223372e+18) & (long)uVar3 >> 0x3f | uVar3;
  fVar5 = (float)new_num_buckets *
          (this->settings).
          super_sh_hashtable_settings<const_char_*,_std::hash<const_char_*>,_unsigned_long,_4>.
          shrink_factor_;
  uVar3 = (ulong)fVar5;
  (this->settings).
  super_sh_hashtable_settings<const_char_*,_std::hash<const_char_*>,_unsigned_long,_4>.
  shrink_threshold_ = (long)(fVar5 - 9.223372e+18) & (long)uVar3 >> 0x3f | uVar3;
  (this->settings).
  super_sh_hashtable_settings<const_char_*,_std::hash<const_char_*>,_unsigned_long,_4>.
  consider_shrink_ = false;
  return;
}

Assistant:

void clear_to_size(size_type new_num_buckets) {
    if (!table) {
      table = val_info.allocate(new_num_buckets);
    } else {
      destroy_buckets(0, num_buckets);
      if (new_num_buckets != num_buckets) {  // resize, if necessary
        typedef std::integral_constant<
            bool, std::is_same<value_alloc_type,
                               libc_allocator_with_realloc<value_type>>::value>
            realloc_ok;
        resize_table(num_buckets, new_num_buckets, realloc_ok());
      }
    }
    assert(table);
    fill_range_with_empty(table, new_num_buckets);
    num_elements = 0;
    num_deleted = 0;
    num_buckets = new_num_buckets;  // our new size
    settings.reset_thresholds(bucket_count());
  }